

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWebAssemblyModulePrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *prototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,2,0);
  this = RecyclableObject::GetLibrary(&prototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&prototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyModuleConstructor);
  AddMember(this,prototype,0x67,*ppRVar2);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<19ul>(this,(char16 (*) [19])0x19955c4);
    AddMember(this,prototype,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyModulePrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 2);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyModuleConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Module")), PropertyConfigurable);
        }
        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }